

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O2

void __thiscall gdsAREF::reset(gdsAREF *this)

{
  std::__cxx11::string::assign((char *)&this->name);
  (this->aref_transformation_flags).super__Base_bitset<1UL>._M_w = 0;
  this->reflection = false;
  *(undefined4 *)&this->angle = 0;
  *(undefined4 *)((long)&this->angle + 4) = 0;
  *(undefined4 *)&this->scale = 0;
  *(undefined4 *)((long)&this->scale + 4) = 0x3ff00000;
  this->propattr = 0;
  this->colCnt = 0;
  this->rowCnt = 0;
  this->xCor = 0;
  this->yCor = 0;
  this->xCorRow = 0;
  this->yCorRow = 0;
  this->xCorCol = 0;
  this->yCorCol = 0;
  std::__cxx11::string::assign((char *)&this->propvalue);
  return;
}

Assistant:

void gdsAREF::reset()
{
  name = "\0";
  aref_transformation_flags.reset();
  reflection = false;
  angle = 0;
  scale = 1;
  colCnt = 0;
  rowCnt = 0;
  xCor = 0;
  yCor = 0;
  xCorRow = 0; // X_2
  yCorRow = 0; // Y_2
  xCorCol = 0; // X_3
  yCorCol = 0; // Y_3
  propattr = 0;
  propvalue = "\0";
}